

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  element_type *peVar2;
  ulong uVar3;
  ScopedElement *this_00;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ScopedElement e;
  TestCaseStats *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  XmlFormatting in_stack_fffffffffffffe44;
  string *in_stack_fffffffffffffe48;
  ScopedElement *in_stack_fffffffffffffe50;
  XmlFormatting fmt;
  XmlWriter *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  XmlWriter *in_stack_fffffffffffffe68;
  undefined1 local_151 [24];
  undefined1 local_139 [28];
  allocator local_11d [20];
  allocator local_109 [17];
  long local_f8;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8 = in_RSI;
  StreamingReporterBase<Catch::XmlReporter>::testCaseEnded
            ((StreamingReporterBase<Catch::XmlReporter> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"OverallResult",local_109);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             (XmlFormatting)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"success",local_11d);
  local_139[0x1b] = Counts::allOk((Counts *)(local_f8 + 0xb8));
  XmlWriter::ScopedElement::writeAttribute<bool>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (bool *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)local_11d);
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x257355);
  iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"durationInSeconds",(allocator *)(local_139 + 0x1a));
    local_139._17_8_ = Timer::getElapsedSeconds((Timer *)0x2573b2);
    XmlWriter::ScopedElement::writeAttribute<double>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (double *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)(local_139 + 0x1a));
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    in_stack_fffffffffffffe60 = (string *)(in_RDI + 0x170);
    in_stack_fffffffffffffe68 = (XmlWriter *)local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"StdOut",(allocator *)in_stack_fffffffffffffe68);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               (XmlFormatting)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    trim((string *)in_stack_fffffffffffffe58);
    XmlWriter::ScopedElement::writeText
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
    std::__cxx11::string::~string(local_a8);
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)local_139);
  }
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this_00 = (ScopedElement *)(in_RDI + 0x170);
    in_stack_fffffffffffffe58 = (XmlWriter *)local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"StdErr",(allocator *)in_stack_fffffffffffffe58);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               (XmlFormatting)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    trim((string *)in_stack_fffffffffffffe58);
    XmlWriter::ScopedElement::writeText(this_00,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44)
    ;
    fmt = (XmlFormatting)((ulong)this_00 >> 0x20);
    std::__cxx11::string::~string(local_e8);
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)local_151);
  }
  operator|(Newline,Indent);
  XmlWriter::endElement(in_stack_fffffffffffffe58,fmt);
  XmlWriter::ScopedElement::~ScopedElement
            ((ScopedElement *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( testCaseStats.stdOut ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( testCaseStats.stdErr ), XmlFormatting::Newline );

        m_xml.endElement();
    }